

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::SingularVarBigint<long,unsigned_short,true>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  uint uVar1;
  ushort *puVar2;
  char *pcVar3;
  ulong *puVar4;
  ulong uVar5;
  uint *puVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar7 = (ulong)*ptr;
  if (-1 < (long)uVar7) {
    protobuf_assumption_failed
              ("static_cast<int8_t>(*ptr) < 0",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
               ,0x39f);
  }
  uVar8 = (long)ptr[1] << 7 | 0x7f;
  if ((long)uVar8 < 0) {
    uVar5 = (long)ptr[2] << 0xe | 0x3fff;
    if ((long)uVar5 < 0) {
      uVar8 = uVar8 & ((long)ptr[3] << 0x15 | 0x1fffffU);
      if ((long)uVar8 < 0) {
        uVar5 = uVar5 & ((long)ptr[4] << 0x1c | 0xfffffffU);
        if ((long)uVar5 < 0) {
          uVar8 = uVar8 & ((long)ptr[5] << 0x23 | 0x7ffffffffU);
          if ((long)uVar8 < 0) {
            uVar5 = uVar5 & ((long)ptr[6] << 0x2a | 0x3ffffffffffU);
            if ((long)uVar5 < 0) {
              uVar8 = uVar8 & ((long)ptr[7] << 0x31 | 0x1ffffffffffffU);
              if ((long)uVar8 < 0) {
                uVar5 = uVar5 & ((ulong)(byte)ptr[8] << 0x38 | 0xffffffffffffff);
                if ((long)uVar5 < 0) {
                  puVar2 = (ushort *)(ptr + 10);
                  if (ptr[9] != '\x01') {
                    if (ptr[9] < '\0') {
                      puVar2 = (ushort *)0x0;
                      goto LAB_0022c458;
                    }
                    if ((ptr[9] & 1U) == 0) {
                      uVar5 = uVar5 ^ 0x8000000000000000;
                    }
                  }
                }
                else {
                  puVar2 = (ushort *)(ptr + 9);
                }
              }
              else {
                puVar2 = (ushort *)(ptr + 8);
              }
            }
            else {
              puVar2 = (ushort *)(ptr + 7);
            }
          }
          else {
            puVar2 = (ushort *)(ptr + 6);
          }
        }
        else {
          puVar2 = (ushort *)(ptr + 5);
        }
      }
      else {
        puVar2 = (ushort *)(ptr + 4);
      }
    }
    else {
      puVar2 = (ushort *)(ptr + 3);
    }
    uVar8 = uVar8 & uVar5;
  }
  else {
    puVar2 = (ushort *)(ptr + 2);
  }
  uVar7 = uVar7 & uVar8;
LAB_0022c458:
  if (puVar2 == (ushort *)0x0) {
    pcVar3 = Error(msg,(char *)0x0,ctx,data,table,hasbits);
    return pcVar3;
  }
  puVar4 = (ulong *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)puVar4 & 7) != 0) {
    AlignFail(puVar4);
  }
  *puVar4 = -(ulong)((uint)uVar7 & 1) ^ uVar7 >> 1;
  if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar2) {
    if ((ulong)table->has_bits_offset != 0) {
      puVar6 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar6 & 3) != 0) {
        AlignFail();
      }
      *puVar6 = *puVar6 | (uint)hasbits;
    }
    return (char *)puVar2;
  }
  uVar1 = (uint)table->fast_idx_mask & (uint)*puVar2;
  if ((uVar1 & 7) != 0) {
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x452);
  }
  pcVar3 = (char *)(**(code **)(&table[1].has_bits_offset + (uVar1 & 0xfffffff8)))();
  return pcVar3;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::SingularVarBigint(
    PROTOBUF_TC_PARAM_DECL) {
  uint64_t tmp;
  PROTOBUF_ASSUME(static_cast<int8_t>(*ptr) < 0);
  ptr = ParseVarint(ptr, &tmp);

  if (ABSL_PREDICT_FALSE(ptr == nullptr)) {
    PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
  }
  RefAt<FieldType>(msg, data.offset()) =
      ZigZagDecodeHelper<FieldType, zigzag>(tmp);
  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}